

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

bool xercesc_4_0::XMLUri::processAuthority(XMLCh *authSpec,XMLSize_t authLen)

{
  bool bVar1;
  int iVar2;
  XMLCh *pXVar3;
  bool local_65;
  int local_64;
  ulong local_60;
  XMLSize_t i;
  XMLCh *portStr;
  XMLSize_t XStack_48;
  int port;
  XMLSize_t hostLen;
  XMLCh *host;
  XMLCh *pXStack_30;
  int userInfoLen;
  XMLCh *userinfo;
  XMLSize_t start;
  int index;
  XMLSize_t authLen_local;
  XMLCh *authSpec_local;
  
  iVar2 = XMLString::indexOf(authSpec,L'@');
  userinfo = (XMLCh *)0x0;
  host._4_4_ = 0;
  if ((iVar2 == -1) || (authLen <= (ulong)(long)iVar2)) {
    pXStack_30 = L"";
  }
  else {
    userinfo = (XMLCh *)(long)(iVar2 + 1);
    host._4_4_ = iVar2;
    pXStack_30 = authSpec;
  }
  if ((userinfo < authLen) && (authSpec[(long)userinfo] == L'[')) {
    start._4_4_ = XMLString::indexOf(authSpec + (long)userinfo,L']');
    if ((start._4_4_ != -1) && ((ulong)(long)start._4_4_ < authLen)) {
      if (((ulong)((long)userinfo + (long)start._4_4_ + 1) < authLen) &&
         (authSpec[(long)userinfo + (long)start._4_4_ + 1] == L':')) {
        local_64 = start._4_4_ + 1;
      }
      else {
        local_64 = -1;
      }
      start._4_4_ = local_64;
    }
  }
  else {
    start._4_4_ = XMLString::indexOf(authSpec + (long)userinfo,L':');
    if ((start._4_4_ != -1) && (authLen <= (ulong)(long)start._4_4_)) {
      start._4_4_ = -1;
    }
  }
  hostLen = (XMLSize_t)(authSpec + (long)userinfo);
  if (start._4_4_ == -1) {
    XStack_48 = authLen - (long)userinfo;
    userinfo = (XMLCh *)authLen;
  }
  else {
    XStack_48 = (XMLSize_t)start._4_4_;
    userinfo = (XMLCh *)((long)(start._4_4_ + 1) + (long)userinfo);
  }
  portStr._4_4_ = -1;
  if ((((XStack_48 != 0) && (start._4_4_ != -1)) && (userinfo < authLen)) &&
     (pXVar3 = authSpec + (long)userinfo, *pXVar3 != L'\0')) {
    portStr._4_4_ = 0;
    for (local_60 = 0; local_60 < authLen - (long)userinfo; local_60 = local_60 + 1) {
      if (((ushort)pXVar3[local_60] < 0x30) || (0x39 < (ushort)pXVar3[local_60])) {
        portStr._4_4_ = -1;
        XStack_48 = 0;
        hostLen = (XMLSize_t)&XMLUni::fgZeroLenString;
        host._4_4_ = 0;
        pXStack_30 = L"";
        break;
      }
      portStr._4_4_ = portStr._4_4_ * 10 + ((ushort)pXVar3[local_60] - 0x30);
    }
  }
  bVar1 = isValidServerBasedAuthority
                    ((XMLCh *)hostLen,XStack_48,portStr._4_4_,pXStack_30,(long)host._4_4_);
  local_65 = true;
  if (!bVar1) {
    local_65 = isValidRegistryBasedAuthority(authSpec,authLen);
  }
  return local_65;
}

Assistant:

bool XMLUri::processAuthority( const XMLCh* const authSpec
                             , const XMLSize_t authLen)
{
    int index = XMLString::indexOf(authSpec, chAt);
    XMLSize_t start = 0;

    // server = [ [ userinfo "@" ] hostport ]
    // userinfo is everything up @,
    const XMLCh* userinfo;
    int userInfoLen = 0;
    if ((index != -1) && (XMLSize_t(index) < authLen))
    {
        userinfo = authSpec;
        userInfoLen = index;
        start = index + 1;
    }
    else
    {
        userinfo = XMLUni::fgZeroLenString;
    }

    // hostport = host [ ":" port ]
    // host is everything up to ':', or up to
    // and including ']' if followed by ':'.
    //
    // Search for port boundary.
    const XMLCh* host;
    XMLSize_t hostLen = 0;
    if ((start < authLen) && (authSpec[start] == chOpenSquare))
    {
    	index = XMLString::indexOf(&(authSpec[start]), chCloseSquare);
    	if ((index != -1) && (XMLSize_t(index) < authLen))
    	{
            // skip the ']'
            index = ((start + index + 1) < authLen
              && authSpec[start + index + 1] == chColon) ? index+1 : -1;
    	}
    }
    else
    {
        index = XMLString::indexOf(&(authSpec[start]), chColon);
        if (index!=-1 && XMLSize_t(index) >= authLen)
            index = -1;
    }

    host = &(authSpec[start]);
    if (index != -1)
    {
        hostLen = index;
        start += index + 1;  // skip the :
    }
    else
    {
        hostLen = authLen - start;
        start = authLen;
    }

    // port is everything after ":"
    int port = -1;
    if ((hostLen) &&   // non empty host
        (index != -1)                    &&   // ":" found
        (start < authLen)                     )   // ":" is not the last
    {
        const XMLCh* portStr = &(authSpec[start]);
        if (*portStr)
        {
            port = 0;
            for (XMLSize_t i=0; i<(authLen - start); i++)
            {
                if (portStr[i] < chDigit_0 || portStr[i] > chDigit_9)
                {
                  // Assume this is a registry-based authority.
                  //
                  port = -1;
                  hostLen = 0;
                  host = XMLUni::fgZeroLenString;
                  userInfoLen = 0;
                  userinfo = XMLUni::fgZeroLenString;
                  break;
                }

                port = (port * 10) + (int) (portStr[i] - chDigit_0);
            }
        }
    }

    return isValidServerBasedAuthority(host, hostLen, port, userinfo, userInfoLen)
      || isValidRegistryBasedAuthority(authSpec, authLen);
}